

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime_s.c
# Opt level: O1

errno_t ctime_s(char *s,rsize_t maxsize,time_t *timer)

{
  errno_t eVar1;
  tm *timeptr;
  tm tm;
  tm local_34;
  
  if ((((long)maxsize < 0x1a) || (s == (char *)0x0)) || (timer == (time_t *)0x0)) {
    if (0 < (long)maxsize && s != (char *)0x0) {
      *s = '\0';
    }
    eVar1 = 0x16;
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  }
  else {
    timeptr = localtime_s(timer,&local_34);
    eVar1 = asctime_s(s,maxsize,timeptr);
  }
  return eVar1;
}

Assistant:

errno_t ctime_s( char * s, rsize_t maxsize, const time_t * timer )
{
    struct tm tm;

    if ( s == NULL || timer == NULL || maxsize < 26 || maxsize > RSIZE_MAX )
    {
        if ( s != NULL && maxsize > 0 && maxsize <= RSIZE_MAX )
        {
            s[0] = '\0';
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    return asctime_s( s, maxsize, localtime_s( timer, &tm ) );
}